

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O2

half Imf_2_5::uintToHalf(uint ui)

{
  half hVar1;
  half local_a;
  
  hVar1._h = 0x7c00;
  if (ui < 0xffe1) {
    half::half(&local_a,(float)(int)ui);
    hVar1._h = local_a._h;
  }
  return (half)hVar1._h;
}

Assistant:

half	
uintToHalf (unsigned int ui)
{
    if (ui >  HALF_MAX)
	return half::posInf();

    return half ((float) ui);
}